

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O1

bool __thiscall cmProjectCommand::IncludeByVariable(cmProjectCommand *this,string *variable)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  bool bVar2;
  char *__s;
  size_t sVar3;
  bool bVar4;
  string m;
  string local_48;
  
  __s = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,variable);
  bVar4 = true;
  if (__s != (char *)0x0) {
    this_00 = (this->super_cmCommand).Makefile;
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar3);
    bVar2 = cmMakefile::ReadDependentFile(this_00,&local_48,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((!bVar2) && (cmSystemTools::s_FatalErrorOccured == false)) {
      bVar2 = cmSystemTools::GetInterruptFlag();
      if (!bVar2) {
        local_48._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"could not find file:\n  ","");
        std::__cxx11::string::append((char *)&local_48);
        cmCommand::SetError(&this->super_cmCommand,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != paVar1) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        bVar4 = false;
      }
    }
  }
  return bVar4;
}

Assistant:

bool cmProjectCommand::IncludeByVariable(const std::string& variable)
{
  const char* include = this->Makefile->GetDefinition(variable);
  if (!include) {
    return true;
  }

  const bool readit = this->Makefile->ReadDependentFile(include);
  if (readit) {
    return true;
  }

  if (cmSystemTools::GetFatalErrorOccured()) {
    return true;
  }

  std::string m = "could not find file:\n"
                  "  ";
  m += include;
  this->SetError(m);
  return false;
}